

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O3

bool __thiscall gui::TextBox::handleKeyPressed(TextBox *this,KeyEvent *key)

{
  String *this_00;
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  Key KVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  Signal<gui::Widget_*,_const_sf::String_&> *this_01;
  
  bVar2 = Widget::handleKeyPressed(&this->super_Widget,key);
  KVar4 = key->code;
  switch(KVar4) {
  case Enter:
    this_01 = &this->onEnterPressed;
    goto LAB_001a6552;
  case BackSpace:
    if (this->readOnly_ != false) {
      return true;
    }
    if (this->caretPosition_ == 0) {
      return true;
    }
    sVar7 = this->horizontalScroll_;
    if ((sVar7 != 0) &&
       (sVar5 = this->widthCharacters_, sVar6 = sf::String::getSize(&this->boxString_),
       sVar6 <= sVar7 + sVar5)) {
      this->horizontalScroll_ = this->horizontalScroll_ - 1;
    }
    sf::String::erase(&this->boxString_,this->caretPosition_ - 1,1);
    sVar7 = this->caretPosition_ - 1;
    break;
  default:
    goto switchD_001a63c1_caseD_3c;
  case End:
    sVar7 = this->caretPosition_;
    sVar5 = sf::String::getSize(&this->boxString_);
    if (sVar7 != sVar5) {
      sVar7 = sf::String::getSize(&this->boxString_);
      goto LAB_001a656e;
    }
    KVar4 = key->code;
switchD_001a63c1_caseD_3c:
    sVar7 = this->caretPosition_;
    if (sVar7 != 0 && KVar4 == Home) {
      sVar7 = 0;
LAB_001a656e:
      updateCaretPosition(this,sVar7);
      return true;
    }
    if (KVar4 == Right) {
      bVar3 = this->readOnly_;
      if ((bool)bVar3 == true) {
        sVar7 = this->widthCharacters_;
        sVar5 = this->horizontalScroll_;
        sVar6 = sf::String::getSize(&this->boxString_);
        if (sVar7 + sVar5 < sVar6) {
          sVar7 = this->horizontalScroll_ + this->widthCharacters_ + 1;
          goto LAB_001a656e;
        }
        bVar3 = this->readOnly_;
      }
      if ((bVar3 & 1) != 0) {
        return true;
      }
      uVar1 = this->caretPosition_;
      sVar7 = sf::String::getSize(&this->boxString_);
      if (sVar7 <= uVar1) {
        return true;
      }
      sVar7 = this->caretPosition_ + 1;
    }
    else {
      if (KVar4 != Left) {
        return bVar2;
      }
      if (this->readOnly_ == true) {
        sVar7 = this->horizontalScroll_;
      }
      if (sVar7 == 0) {
        return true;
      }
      sVar7 = sVar7 - 1;
    }
    updateCaretPosition(this,sVar7);
    return true;
  case Delete:
    if (this->readOnly_ != false) {
      return true;
    }
    uVar1 = this->caretPosition_;
    this_00 = &this->boxString_;
    sVar7 = sf::String::getSize(this_00);
    if (sVar7 <= uVar1) {
      return true;
    }
    sVar7 = sf::String::getSize(this_00);
    if (sVar7 == 0) {
      return true;
    }
    sVar7 = this->horizontalScroll_;
    if ((sVar7 != 0) &&
       (sVar5 = this->widthCharacters_, sVar6 = sf::String::getSize(this_00), sVar6 <= sVar7 + sVar5
       )) {
      this->horizontalScroll_ = this->horizontalScroll_ - 1;
    }
    sf::String::erase(this_00,this->caretPosition_,1);
    sVar7 = this->caretPosition_;
  }
  bVar2 = true;
  updateCaretPosition(this,sVar7);
  this_01 = &this->onTextChange;
LAB_001a6552:
  Signal<gui::Widget_*,_const_sf::String_&>::emit(this_01,&this->super_Widget,&this->boxString_);
  return bVar2;
}

Assistant:

bool TextBox::handleKeyPressed(const sf::Event::KeyEvent& key) {
    bool eventConsumed = baseClass::handleKeyPressed(key);
    if (key.code == sf::Keyboard::Enter) {
        onEnterPressed.emit(this, boxString_);
        return eventConsumed;
    } else if (key.code == sf::Keyboard::Backspace) {
        if (!readOnly_ && caretPosition_ > 0) {
            if (horizontalScroll_ > 0 && horizontalScroll_ + widthCharacters_ >= boxString_.getSize()) {
                --horizontalScroll_;
            }
            boxString_.erase(caretPosition_ - 1, 1);
            updateCaretPosition(caretPosition_ - 1);
            onTextChange.emit(this, boxString_);
        }
    } else if (key.code == sf::Keyboard::Delete) {
        if (!readOnly_ && caretPosition_ < boxString_.getSize() && boxString_.getSize() > 0) {
            if (horizontalScroll_ > 0 && horizontalScroll_ + widthCharacters_ >= boxString_.getSize()) {
                --horizontalScroll_;
            }
            boxString_.erase(caretPosition_, 1);
            updateCaretPosition(caretPosition_);
            onTextChange.emit(this, boxString_);
        }
    } else if (key.code == sf::Keyboard::End && caretPosition_ != boxString_.getSize()) {
        updateCaretPosition(boxString_.getSize());
    } else if (key.code == sf::Keyboard::Home && caretPosition_ != 0) {
        updateCaretPosition(0);
    } else if (key.code == sf::Keyboard::Left) {
        if (readOnly_ && horizontalScroll_ > 0) {
            updateCaretPosition(horizontalScroll_ - 1);
        } else if (!readOnly_ && caretPosition_ > 0) {
            updateCaretPosition(caretPosition_ - 1);
        }
    } else if (key.code == sf::Keyboard::Right) {
        if (readOnly_ && horizontalScroll_ + widthCharacters_ < boxString_.getSize()) {
            updateCaretPosition(horizontalScroll_ + widthCharacters_ + 1);
        } else if (!readOnly_ && caretPosition_ < boxString_.getSize()) {
            updateCaretPosition(caretPosition_ + 1);
        }
    } else {
        return eventConsumed;
    }
    return true;
}